

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

char * anon_unknown.dwarf_13fc48::ReadString(string *s,char *ptr)

{
  char *__end;
  allocator<char> local_49;
  string local_48 [32];
  char *local_28;
  char *q;
  char *p;
  char *ptr_local;
  string *s_local;
  
  for (local_28 = ptr; __end = local_28, *local_28 != '\0'; local_28 = local_28 + 1) {
  }
  q = ptr;
  p = ptr;
  ptr_local = (char *)s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(local_48,ptr,__end,&local_49);
  std::__cxx11::string::operator=((string *)ptr_local,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return local_28 + 1;
}

Assistant:

const char *ReadString(std::string &s, const char *ptr) {
  // Read untile NULL(\0).
  const char *p = ptr;
  const char *q = ptr;
  while ((*q) != 0)
    q++;

  s = std::string(p, q);

  return q + 1; // skip '\0'
}